

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerStrategy.cpp
# Opt level: O2

bool __thiscall
CheaterBotStrategy::exchangeCountryOwnership
          (CheaterBotStrategy *this,Player *defendingPlayer,Country *toExchange)

{
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *this_00;
  Player *pPVar1;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *this_01;
  bool bVar2;
  reference ppCVar3;
  int toExchangeIndex;
  int iVar4;
  ulong uVar5;
  int i;
  ulong __n;
  
  uVar5 = 0xffffffffffffffff;
  __n = 0;
  while( true ) {
    this_00 = defendingPlayer->pOwnedCountries;
    iVar4 = (int)uVar5;
    if ((ulong)((long)(this_00->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this_00->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)
                      ._M_impl.super__Vector_impl_data._M_start >> 3) <= __n) break;
    ppCVar3 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::at(this_00,__n);
    if (*(*ppCVar3)->cyID == *toExchange->cyID) {
      if (iVar4 != -1) goto LAB_0010a98e;
      uVar5 = __n & 0xffffffff;
    }
    __n = __n + 1;
  }
  if (iVar4 == -1) {
LAB_0010a98e:
    bVar2 = false;
  }
  else {
    pPVar1 = (this->super_PlayerStrategy).player;
    *toExchange->pPlayerOwnerId = *pPVar1->pPlayerId;
    this_01 = pPVar1->pOwnedCountries;
    ppCVar3 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::at(this_00,(long)iVar4);
    std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::push_back(this_01,ppCVar3);
    std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::erase
              (defendingPlayer->pOwnedCountries,
               (const_iterator)
               ((defendingPlayer->pOwnedCountries->
                super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
                super__Vector_impl_data._M_start + iVar4));
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool CheaterBotStrategy::exchangeCountryOwnership(Player* defendingPlayer, Map::Country* toExchange) {
    int toExchangeIndex = -1;

    for (int i = 0; i < defendingPlayer->getOwnedCountries()->size(); i++) {
        if (defendingPlayer->getOwnedCountries()->at(i)->getCountryId() == toExchange->getCountryId()) {
            if (toExchangeIndex != -1) {
                return false;
            }
            toExchangeIndex = i;
        }
    }

    if (toExchangeIndex == -1) {
        return false;
    }

    toExchange->setPlayerOwnerID(this->player->getPlayerId());
    this->player->getOwnedCountries()->push_back(defendingPlayer->getOwnedCountries()->at(toExchangeIndex));
    defendingPlayer->getOwnedCountries()->erase(defendingPlayer->getOwnedCountries()->begin() + toExchangeIndex);
    return true;
}